

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_function_proto_fileName(JSContext *ctx,JSValue this_val)

{
  long lVar1;
  ulong uVar2;
  JSValue JVar3;
  
  if ((int)this_val.tag == -1) {
    uVar2 = (ulong)*(ushort *)((long)this_val.u.ptr + 6);
    lVar1 = 0;
    if ((uVar2 < 0x32) && ((0x2200000012000U >> (uVar2 & 0x3f) & 1) != 0)) {
      lVar1 = *(long *)((long)this_val.u.ptr + 0x30);
    }
  }
  else {
    lVar1 = 0;
  }
  if ((lVar1 == 0) || ((*(byte *)(lVar1 + 0x1a) & 4) == 0)) {
    JVar3 = (JSValue)(ZEXT816(3) << 0x40);
  }
  else {
    JVar3 = __JS_AtomToValue(ctx,*(JSAtom *)(lVar1 + 0x60),1);
  }
  return JVar3;
}

Assistant:

static JSValue js_function_proto_fileName(JSContext *ctx,
                                          JSValueConst this_val)
{
    JSFunctionBytecode *b = JS_GetFunctionBytecode(this_val);
    if (b && b->has_debug) {
        return JS_AtomToString(ctx, b->debug.filename);
    }
    return JS_UNDEFINED;
}